

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encryption.cc
# Opt level: O0

fdb_status
fdb_encrypt_blocks(encryptor *e,void *dst_buf,void *src_buf,size_t blocksize,uint num_blocks,
                  bid_t start_bid)

{
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long *in_RDI;
  uint in_R8D;
  long in_R9;
  uint i;
  fdb_status status;
  uint local_38;
  fdb_status local_34;
  
  local_34 = FDB_RESULT_SUCCESS;
  local_38 = 0;
  while ((local_38 < in_R8D &&
         (local_34 = (**(code **)(*in_RDI + 8))
                               (in_RDI,1,in_RSI + (ulong)local_38 * in_RCX,
                                in_RDX + (ulong)local_38 * in_RCX,in_RCX,in_R9 + (ulong)local_38),
         local_34 == FDB_RESULT_SUCCESS))) {
    local_38 = local_38 + 1;
  }
  return local_34;
}

Assistant:

fdb_status fdb_encrypt_blocks(encryptor *e,
                              void *dst_buf,
                              const void *src_buf,
                              size_t blocksize,
                              unsigned num_blocks,
                              bid_t start_bid)
{
#ifdef FDB_LOG_CRYPTO
    fprintf(stderr, "CRYPT: Encrypting blocks #%llu-%llu with key %d:%llx\n",
            start_bid, start_bid+num_blocks-1,
            e->key.algorithm, *(uint64_t*)e->key.bytes);
#endif
    fdb_status status = FDB_RESULT_SUCCESS;
    for (unsigned i = 0; i < num_blocks; i++) {
        status = e->ops->crypt(e,
                               true,
                               (uint8_t*)dst_buf + i*blocksize,
                               (const uint8_t*)src_buf + i*blocksize,
                               blocksize,
                               start_bid + i);
        if (status != FDB_RESULT_SUCCESS)
            break;
    }
    return status;
}